

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostzposix.c
# Opt level: O2

int os_get_zoneinfo_key(char *buf,size_t buflen)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ushort **ppuVar6;
  FILE *__stream;
  size_t sVar7;
  void *s1;
  char *pcVar8;
  char *pcVar9;
  char **ppcVar10;
  bool bVar11;
  unsigned_long mode;
  char linkbuf [4096];
  
  pcVar5 = getenv("TZ");
  if ((pcVar5 == (char *)0x0) || (cVar1 = *pcVar5, cVar1 == '\0')) {
LAB_002212ff:
    __stream = fopen("/etc/timezone","r");
    if (__stream == (FILE *)0x0) {
LAB_0022138a:
      __stream = fopen("/etc/sysconfig/clock","r");
      if (__stream == (FILE *)0x0) {
LAB_0022147d:
        iVar4 = osfmode("/etc/localtime",0,&mode,(unsigned_long *)0x0);
        if (iVar4 == 0) {
          return 0;
        }
        if ((mode._1_1_ & 0xa0) == 0) {
          return 0;
        }
        iVar4 = os_resolve_symlink("/etc/localtime",linkbuf,0x1000);
        if (iVar4 == 0) {
          return 0;
        }
        pcVar5 = strstr(linkbuf,"/zoneinfo/");
        if (pcVar5 == (char *)0x0) {
          return 0;
        }
LAB_002214e0:
        pcVar8 = pcVar5 + 10;
        goto LAB_00221559;
      }
      do {
        do {
          pcVar5 = fgets(linkbuf,0x100,__stream);
          if (pcVar5 == (char *)0x0) goto LAB_0022146c;
          ppuVar6 = __ctype_b_loc();
          s1 = (void *)((long)&mode + 7);
          pcVar8 = linkbuf + 3;
          do {
            pcVar5 = pcVar8;
            pcVar9 = (char *)((long)s1 + 1);
            s1 = (void *)((long)s1 + 1);
            pcVar8 = pcVar5 + 1;
          } while ((*(byte *)((long)*ppuVar6 + (long)*pcVar9 * 2 + 1) & 0x20) != 0);
          iVar4 = memicmp(s1,"zone",4);
        } while (iVar4 != 0);
        do {
          pcVar8 = pcVar5 + 1;
          pcVar5 = pcVar5 + 1;
        } while ((*(byte *)((long)*ppuVar6 + (long)*pcVar8 * 2 + 1) & 0x20) != 0);
      } while (*pcVar8 != '=');
      do {
        pcVar8 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
      } while ((*(byte *)((long)*ppuVar6 + (long)*pcVar8 * 2 + 1) & 0x20) != 0);
      if (*pcVar8 == '/') {
        pcVar5 = strstr(pcVar5,"/zoneinfo/");
        if (pcVar5 == (char *)0x0) {
LAB_0022146c:
          fclose(__stream);
          goto LAB_0022147d;
        }
        pcVar5 = pcVar5 + 10;
      }
    }
    else {
      pcVar5 = fgets(linkbuf,0x100,__stream);
      if (pcVar5 == (char *)0x0) {
LAB_00221382:
        fclose(__stream);
        goto LAB_0022138a;
      }
      sVar7 = strlen(linkbuf);
      if ((sVar7 != 0) && (linkbuf[sVar7 - 1] == '\n')) {
        linkbuf[sVar7 - 1] = '\0';
      }
      if (linkbuf[0] == '/') {
        pcVar5 = strstr(linkbuf,"/zoneinfo/");
        if (pcVar5 == (char *)0x0) goto LAB_00221382;
        pcVar5 = pcVar5 + 10;
      }
      else {
        pcVar5 = linkbuf;
      }
    }
    safe_strcpy(buf,buflen,pcVar5);
    fclose(__stream);
  }
  else {
    bVar11 = true;
    if ((cVar1 != ':') &&
       ((ppuVar6 = __ctype_b_loc(), cVar1 != '/' && (((*ppuVar6)[cVar1] & 0x400) == 0)))) {
      bVar11 = cVar1 == '_';
    }
    pcVar8 = pcVar5 + 1;
    pcVar9 = pcVar8;
    while( true ) {
      cVar2 = *pcVar9;
      if ((long)cVar2 == 0) break;
      ppuVar6 = __ctype_b_loc();
      bVar3 = (bool)((*(byte *)((long)*ppuVar6 + (long)cVar2 * 2 + 1) & 4) >> 2 & bVar11);
      if (cVar2 == '/') {
        bVar3 = bVar11;
      }
      if (cVar2 != '_') {
        bVar11 = bVar3;
      }
      pcVar9 = pcVar9 + 1;
    }
    if (bVar11 == false) goto LAB_002212ff;
    if (cVar1 == '/') {
LAB_002212e7:
      pcVar5 = strstr(pcVar5,"/zoneinfo/");
      if (pcVar5 == (char *)0x0) goto LAB_002212ff;
      goto LAB_002214e0;
    }
    if (cVar1 != ':') {
      for (ppcVar10 = os_get_zoneinfo_key::dirs; *ppcVar10 != (char *)0x0; ppcVar10 = ppcVar10 + 1)
      {
        os_build_full_path(linkbuf,0x1000,*ppcVar10,pcVar5);
        iVar4 = access(linkbuf,0);
        pcVar8 = pcVar5;
        if (iVar4 == 0) goto LAB_00221559;
      }
      goto LAB_002212ff;
    }
    if (*pcVar8 == '/') goto LAB_002212e7;
LAB_00221559:
    safe_strcpy(buf,buflen,pcVar8);
  }
  return 1;
}

Assistant:

int
os_get_zoneinfo_key( char *buf, size_t buflen )
{
    /* First, try the TZ environment variable.  This is used on nearly
     * all Unix-alikes for a per-process timezone setting, although
     * it will only contain a zoneinfo key in newer versions.  There
     * are several possible formats for specifying a zoneinfo key:
     *
     *  TZ=/usr/share/zoneinfo/America/Los_Angeles
     *    - A full absolute path name to a tzinfo file.  We'll sense
     *      this by looking for "/zoneinfo/" in the string, and if we
     *      find it, we'll return the portion after /zoneinfo/.
     *
     *  TZ=America/Los_Angeles
     *    - Just the zoneinfo key, without a path.  If we find a string
     *      that contains all alphabetics, undersores, and slashes, and
     *      has at least one internal slash but doesn't start with a
     *      slash, we probably have a zoneinfo key.  We'll see if we
     *      can find a matching file in the usual zoneinfo database
     *      locations: /etc/zoneinfo, /usr/share/zoneinfo; if we can,
     *      we'll return the key name, otherwise we'll assume this
     *      isn't actually a zoneinfo key but just happens to look like
     *      one in terms of format.
     *
     *  TZ=:America/Los_Angeles
     *  TZ=:/etc/zoneinfo/America/Los_Angeles
     *    - POSIX systems generally use the ":" prefix to signify that
     *      this is a zoneinfo path rather than the old-style "EST5EDT"
     *      type of self-contained zone description.  If we see a colon
     *      prefix with a relative path (properly formed in terms of
     *      its character content), we'll simply assume this is a
     *      zoneinfo key without even checking for an existing file,
     *      since there's not much else it could be.  If we see an
     *      absolute path, we'll search it for /zoneinfo/ and return
     *      the portion after this, again without checking for an
     *      existing file.
     */
    const char *tz = getenv("TZ");
    if (tz != 0 && tz[0] != '\0')
    {
        /* check that the string is formatted like a zoneinfo key */
#define tzcharok(c) (isalpha(c) != 0 || (c) == '/' || (c) == '_')
        int fmt_ok = TRUE;
        const char *p;
        fmt_ok &= (tz[0] == ':' || tzcharok(tz[0]));
        for (p = tz + 1 ; *p != '\0' ; ++p)
            fmt_ok &= tzcharok(*p);

        /* proceed only if it has the right format */
        if (fmt_ok)
        {
            /* check for a leading ':', per POSIX */
            if (tz[0] == ':')
            {
                /* yes, we have a leading ':', so it's almost certainly
                 * a zoneinfo key; if it's an absolute path, find the
                 * part after /zoneinfo/
                 */
                if (tz[1] == '/')
                {
                    /* absolute form - look for /zoneinfo/ */
                    const char *z = strstr(tz, "/zoneinfo/");
                    if (z != 0)
                    {
                        /* found it - return the part after /zoneinfo/ */
                        safe_strcpy(buf, buflen, z + 10);
                        return TRUE;
                    }
                }
                else
                {
                    /* relative path - return as-is minus the colon */
                    safe_strcpy(buf, buflen, tz + 1);
                    return TRUE;
                }
            }
            else
            {
                /* There's no colon, so it *might* be a zoneinfo key.
                 * If it's an absolute path containing /zoneinfo/, it's
                 * a solid bet.  If it's a relative path, look to see
                 * if we can find a file in one of the usual zoneinfo
                 * database locations.
                 */
                if (tz[0] == '/')
                {
                    /* absolute path - check for /zoneinfo/ */
                    const char *z = strstr(tz, "/zoneinfo/");
                    if (z != 0)
                    {
                        /* found it - return the part after /zoneinfo/ */
                        safe_strcpy(buf, buflen, z + 10);
                        return TRUE;
                    }
                }
                else
                {
                    /* relative path - look for a tzinfo file in the
                     * usual locations
                     */
                    static const char *dirs[] = {
                        "/etc/zoneinfo",
                        "/usr/share/zoneinfo",
                        0
                    };
                    const char **dir;
                    for (dir = dirs ; *dir != 0 ; ++dir)
                    {
                        /* build this full path */
                        char fbuf[OSFNMAX];
                        os_build_full_path(fbuf, sizeof(fbuf), *dir, tz);

                        /* check for a file at this location */
                        if (!osfacc(fbuf))
                        {
                            /* got it - looks like a good zoneinfo key */
                            safe_strcpy(buf, buflen, tz);
                            return TRUE;
                        }
                    }
                }
            }
        }
    }

    /* No luck with TZ, so try the system-wide settings next.
     *
     * If a file called /etc/timezone exists, it's usually a one-line
     * text file containing the zoneinfo key.  Read and return its
     * contents.
     */
    FILE *fp;
    if ((fp = fopen("/etc/timezone", "r")) != 0)
    {
        /* read the one-liner */
        char lbuf[256];
        int ok = FALSE;
        if (fgets(lbuf, sizeof(lbuf), fp) != 0)
        {
            /* strip any trailing newline */
            size_t l = strlen(lbuf);
            if (l != 0 && lbuf[l-1] == '\n')
                lbuf[l-1] = '\0';

            /* if it's in absolute format, return the part after
             * /zoneinfo/; otherwise just return the string
             */
            if (lbuf[0] == '/')
            {
                /* absoltue path - find /zoneinfo/ */
                const char *z = strstr(lbuf, "/zoneinfo/");
                if (z != 0)
                {
                    safe_strcpy(buf, buflen, z + 10);
                    ok = TRUE;
                }
            }
            else
            {
                /* relative notation - return it as-is */
                safe_strcpy(buf, buflen, lbuf);
                ok = TRUE;
            }
        }

        /* we're done with the file */
        fclose(fp);

        /* if we got our result, return success */
        if (ok)
            return TRUE;
    }

    /* If /etc/sysconfig/clock exists, read it and look for a line
     * starting with ZONE=.  This contains the zoneinfo key.
     */
    if ((fp = fopen("/etc/sysconfig/clock", "r")) != 0)
    {
        /* scan the file for ZONE=... */
        int ok = FALSE;
        for (;;)
        {
            /* read the next line */
            char lbuf[256];
            if (fgets(lbuf, sizeof(lbuf), fp) == 0)
                break;

            /* skip leading spaces */
            const char *p;
            for (p = lbuf ; isspace(*p) ; ++p) ;

            /* check for ZONE */
            if (memicmp(p, "zone", 4) != 0)
                continue;

            /* skip spaces after ZONE */
            for (p += 4 ; isspace(*p) ; ++p) ;

            /* check for '=' */
            if (*p != '=')
                continue;

            /* skip spaces after the '=' */
            for (++p ; isspace(*p) ; ++p) ;

            /* if it's in absolute form, look for /zoneinfo/ */
            if (*p == '/')
            {
                const char *z = strstr(p, "/zoneinfo/");
                if (z != 0)
                {
                    safe_strcpy(buf, buflen, z + 10);
                    ok = TRUE;
                }
            }
            else
            {
                /* relative notation - it's the zoneinfo key */
                safe_strcpy(buf, buflen, p);
                ok = TRUE;
            }

            /* that's our ZONE line, so we're done scanning the file */
            break;
        }

        /* done with the file */
        fclose(fp);

        /* if we got our result, return success */
        if (ok)
            return TRUE;
    }

    /* If /etc/localtime is a symbolic link, the linked file is the
     * actual zoneinfo file.  Resolve the link and return the portion
     * of the path after "/zoneinfo/".
     */
    static const char *elt = "/etc/localtime";
    unsigned long mode;
    char linkbuf[OSFNMAX];
    const char *zi;
    if (osfmode(elt, FALSE, &mode, NULL)
        && (mode & OSFMODE_LINK) != 0
        && os_resolve_symlink(elt, linkbuf, sizeof(linkbuf))
        && (zi = strstr(linkbuf, "/zoneinfo/")) != 0)
    {
        /* it's a link containing /zoneinfo/, so return the portion
         * after /zoneinfo/
         */
        safe_strcpy(buf, buflen, zi + 10);
        return TRUE;
    }

    /* well, we're out of ideas - return failure */
    return FALSE;
}